

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall TArray<side_t,_side_t>::Push(TArray<side_t,_side_t> *this,side_t *item)

{
  uint uVar1;
  side_t *item_local;
  TArray<side_t,_side_t> *this_local;
  
  Grow(this,1);
  side_t::side_t(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}